

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_unvoiced_vowel.c
# Opt level: O2

void njd_set_unvoiced_vowel(NJD *njd)

{
  NJDNode *node;
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  NJDNode *pNVar7;
  char *pcVar8;
  int iVar9;
  int local_4b8;
  int flag1;
  int atype2;
  int midx2;
  int size1;
  int atype1;
  int midx1;
  int flag3;
  int size2;
  int local_494;
  int local_490;
  int size3;
  NJDNode *nlink2;
  NJDNode *local_480;
  NJDNode *nlink3;
  NJDNode *nlink1;
  char *mora3;
  char *mora2;
  char *mora1;
  int local_44c;
  char *local_448;
  size_t local_440;
  char buff [1024];
  
  mora1 = (char *)0x0;
  mora2 = (char *)0x0;
  mora3 = (char *)0x0;
  nlink1 = (NJDNode *)0x0;
  nlink2 = (NJDNode *)0x0;
  nlink3 = (NJDNode *)0x0;
  size1 = 0;
  size2 = 0;
  size3 = 0;
  flag1 = -1;
  local_4b8 = -1;
  flag3 = -1;
  midx1 = 0;
  atype1 = 0;
  atype2 = 0;
  midx2 = 1;
  pcVar5 = (char *)0x0;
  pcVar8 = (char *)0x0;
  do {
    pNVar7 = njd->head;
    if (pNVar7 == (NJDNode *)0x0) {
      return;
    }
    buff[0] = '\0';
    pcVar4 = NJDNode_get_pron(pNVar7);
    local_440 = strlen(pcVar4);
    iVar1 = 0;
    local_480 = pNVar7;
    while (iVar1 < (int)local_440) {
      pcVar4 = pcVar8;
      if ((pcVar8 == (char *)0x0) &&
         (get_mora_information(pNVar7,iVar1,&mora1,&nlink1,&flag1,&size1,&midx1,&atype1),
         pcVar4 = mora1, mora1 == (char *)0x0)) {
        fwrite("WARNING: set_unvoiced_vowel() in njd_set_unvoiced_vowel.c: Wrong pron.",0x46,1,
               _stderr);
        return;
      }
      if (pcVar5 == (char *)0x0) {
        midx2 = midx1 + 1;
        atype2 = atype1;
        get_mora_information(pNVar7,size1 + iVar1,&mora2,&nlink2,&local_4b8,&size2,&midx2,&atype2);
      }
      local_490 = midx2 + 1;
      local_494 = atype2;
      local_44c = iVar1;
      get_mora_information
                (pNVar7,size1 + iVar1 + size2,&mora3,&nlink3,&flag3,&size3,&local_490,&local_494);
      pcVar8 = mora2;
      node = nlink3;
      pNVar7 = nlink2;
      local_448 = mora3;
      if ((((mora3 != (char *)0x0 && mora2 != (char *)0x0) && (nlink2 != nlink3 && nlink1 == nlink2)
           ) && ((iVar1 = strcmp(pcVar4,anon_var_dwarf_ec935 + 3), iVar1 == 0 ||
                 (iVar1 = strcmp(pcVar4,anon_var_dwarf_e6461), iVar1 == 0)))) &&
         (iVar1 = strcmp(pcVar8,anon_var_dwarf_f04a3 + 0xc), iVar1 == 0)) {
        pcVar5 = NJDNode_get_pos(pNVar7);
        iVar1 = strcmp(pcVar5,anon_var_dwarf_eeff2 + 3);
        if (iVar1 != 0) {
          pcVar5 = NJDNode_get_pos(pNVar7);
          iVar1 = strcmp(pcVar5,anon_var_dwarf_f04fb + 6);
          if (iVar1 != 0) {
            pcVar5 = NJDNode_get_pos(pNVar7);
            iVar1 = strcmp(pcVar5,anon_var_dwarf_eeff2);
            if (iVar1 != 0) goto LAB_0017364e;
          }
        }
        pcVar5 = NJDNode_get_pron(node);
        iVar1 = strcmp(pcVar5,anon_var_dwarf_9a1 + 0x12);
        if (iVar1 != 0) {
          pcVar5 = NJDNode_get_pron(node);
          iVar1 = strcmp(pcVar5,anon_var_dwarf_ec2d7 + 6);
          if (iVar1 != 0) {
            local_4b8 = 1;
            goto LAB_0017364e;
          }
        }
        local_4b8 = 0;
      }
LAB_0017364e:
      pNVar7 = nlink2;
      iVar9 = flag3;
      iVar1 = flag1;
      iVar3 = local_4b8;
      if ((((pcVar8 == (char *)0x0) || (flag1 == 1)) || (local_4b8 != -1)) || (flag3 == 1)) {
LAB_00173694:
        pNVar7 = local_480;
        if (iVar1 == -1) {
          pcVar5 = NJDNode_get_pos(nlink1);
          iVar1 = strcmp(pcVar5,anon_var_dwarf_e9296);
          pNVar7 = local_480;
          if (iVar1 == 0) {
LAB_0017375a:
            flag1 = 0;
            iVar1 = 0;
          }
          else if (iVar3 == 1) {
            flag1 = 0;
            iVar1 = 0;
            iVar3 = 1;
          }
          else {
            if (atype1 == midx1 + 1) goto LAB_0017375a;
            iVar1 = apply_unvoice_rule(pcVar4,pcVar8);
            flag1 = iVar1;
          }
        }
      }
      else {
        pcVar5 = NJDNode_get_pron(nlink2);
        iVar2 = strcmp(pcVar5,anon_var_dwarf_f0511 + 0xf);
        iVar3 = -1;
        if (iVar2 != 0) goto LAB_00173694;
        pcVar5 = NJDNode_get_pos(pNVar7);
        iVar3 = strcmp(pcVar5,anon_var_dwarf_eeff2 + 3);
        if (iVar3 != 0) {
          pcVar5 = NJDNode_get_pos(pNVar7);
          iVar3 = strcmp(pcVar5,anon_var_dwarf_f04fb + 6);
          if (iVar3 != 0) {
            pcVar5 = NJDNode_get_pos(pNVar7);
            iVar2 = strcmp(pcVar5,anon_var_dwarf_f0022 + 10);
            iVar3 = -1;
            if (iVar2 != 0) goto LAB_00173694;
          }
        }
        if (atype2 == midx2 + 1) {
          local_4b8 = 0;
          iVar3 = 0;
          goto LAB_00173694;
        }
        iVar3 = apply_unvoice_rule(pcVar8,local_448);
        local_4b8 = iVar3;
        if (iVar3 != 1) goto LAB_00173694;
        if (iVar1 == -1) {
          flag1 = 0;
          iVar1 = 0;
        }
        if (iVar9 == -1) {
          flag3 = 0;
          iVar9 = 0;
        }
        iVar3 = 1;
        pNVar7 = local_480;
      }
      if (iVar3 == -1 && iVar1 == 1) {
        iVar3 = 0;
      }
      local_4b8 = iVar3;
      strcat(buff,pcVar4);
      if (iVar1 == 1) {
        sVar6 = strlen(buff);
        builtin_strncpy(buff + sVar6,"’",4);
      }
      nlink1 = nlink2;
      iVar2 = size2;
      midx1 = midx2;
      atype1 = atype2;
      mora2 = local_448;
      nlink2 = nlink3;
      size2 = size3;
      mora3 = (char *)0x0;
      midx2 = local_490;
      nlink3 = (NJDNode *)0x0;
      size3 = 0;
      atype2 = local_494;
      flag3 = -1;
      local_490 = 0;
      local_494 = 0;
      iVar1 = local_44c + size1;
      pcVar5 = local_448;
      local_4b8 = iVar9;
      flag1 = iVar3;
      size1 = iVar2;
      mora1 = pcVar8;
    }
    NJDNode_set_pron(pNVar7,buff);
    njd = (NJD *)&pNVar7->next;
  } while( true );
}

Assistant:

void njd_set_unvoiced_vowel(NJD * njd)
{
   NJDNode *node;
   int index;
   int len;
   char buff[MAXBUFLEN];
   const char *str;

   /* mora information for current, next, and next-next moras */
   const char *mora1 = NULL, *mora2 = NULL, *mora3 = NULL;
   NJDNode *nlink1 = NULL, *nlink2 = NULL, *nlink3 = NULL;
   int size1 = 0, size2 = 0, size3 = 0;
   int flag1 = -1, flag2 = -1, flag3 = -1;      /* unknown:-1, voice:0, unvoiced:1 */
   int midx1 = 0, midx2 = 1, midx3 = 2;
   int atype1 = 0, atype2 = 0, atype3 = 0;

   for (node = njd->head; node != NULL; node = node->next) {
      buff[0] = '\0';

      /* get pronunciation */
      str = NJDNode_get_pron(node);
      len = strlen(str);

      /* parse pronunciation */
      for (index = 0; index < len;) {
         /* get mora information */
         if (mora1 == NULL)
            get_mora_information(node, index, &mora1, &nlink1, &flag1, &size1, &midx1, &atype1);
         if (mora1 == NULL) {
            fprintf(stderr,
                    "WARNING: set_unvoiced_vowel() in njd_set_unvoiced_vowel.c: Wrong pron.");
            return;
         }
         if (mora2 == NULL) {
            midx2 = midx1 + 1;
            atype2 = atype1;
            get_mora_information(node, index + size1, &mora2, &nlink2, &flag2, &size2, &midx2,
                                 &atype2);
         }
         if (mora3 == NULL) {
            midx3 = midx2 + 1;
            atype3 = atype2;
            get_mora_information(node, index + size1 + size2, &mora3, &nlink3, &flag3, &size3,
                                 &midx3, &atype3);
         }

         /* rule 1: look-ahead for 'masu' and 'desu' */
         if (mora2 != NULL && mora3 != NULL && nlink1 == nlink2 && nlink2 != nlink3 &&
             (strcmp(mora1, NJD_SET_UNVOICED_VOWEL_MA) == 0
              || strcmp(mora1, NJD_SET_UNVOICED_VOWEL_DE) == 0)
             && strcmp(mora2, NJD_SET_UNVOICED_VOWEL_SU) == 0
             && (strcmp(NJDNode_get_pos(nlink2), NJD_SET_UNVOICED_VOWEL_DOUSHI) == 0
                 || strcmp(NJDNode_get_pos(nlink2), NJD_SET_UNVOICED_VOWEL_JODOUSHI) == 0
                 || strcmp(NJDNode_get_pos(nlink2), NJD_SET_UNVOICED_VOWEL_KANDOUSHI) == 0)
             ) {
            if (strcmp(NJDNode_get_pron(nlink3), NJD_SET_UNVOICED_VOWEL_QUESTION) == 0
                || strcmp(NJDNode_get_pron(nlink3), NJD_SET_UNVOICED_VOWEL_CHOUON) == 0)
               flag2 = 0;
            else
               flag2 = 1;
         }

         /* rule 2: look-ahead for 'shi' */
         if (flag1 != 1 && flag2 == -1 && flag3 != 1 && mora2 != NULL &&
             strcmp(NJDNode_get_pron(nlink2), NJD_SET_UNVOICED_VOWEL_SHI) == 0 &&
             (strcmp(NJDNode_get_pos(nlink2), NJD_SET_UNVOICED_VOWEL_DOUSHI) == 0 ||
              strcmp(NJDNode_get_pos(nlink2), NJD_SET_UNVOICED_VOWEL_JODOUSHI) == 0 ||
              strcmp(NJDNode_get_pos(nlink2), NJD_SET_UNVOICED_VOWEL_JOSHI) == 0)) {
            if (atype2 == midx2 + 1) {
               /* rule 4 */
               flag2 = 0;
            } else {
               /* rule 5 */
               flag2 = apply_unvoice_rule(mora2, mora3);
            }
            if (flag2 == 1) {
               if (flag1 == -1)
                  flag1 = 0;
               if (flag3 == -1)
                  flag3 = 0;
            }
         }

         /* estimate unvoice */
         if (flag1 == -1) {
            if (strcmp(NJDNode_get_pos(nlink1), NJD_SET_UNVOICED_VOWEL_FILLER) == 0) {
               /* rule 0 */
               flag1 = 0;
            } else if (flag2 == 1) {
               /* rule 3 */
               flag1 = 0;
            } else if (atype1 == midx1 + 1) {
               /* rule 4 */
               flag1 = 0;
            } else {
               /* rule 5 */
               flag1 = apply_unvoice_rule(mora1, mora2);
            }
         }
         if (flag1 == 1 && flag2 == -1) {
            flag2 = 0;
         }

         /* store pronunciation */
         strcat(buff, mora1);
         if (flag1 == 1)
            strcat(buff, NJD_SET_UNVOICED_VOWEL_QUOTATION);

         /* prepare next step */
         index += size1;

         mora1 = mora2;
         nlink1 = nlink2;
         size1 = size2;
         flag1 = flag2;
         midx1 = midx2;
         atype1 = atype2;

         mora2 = mora3;
         nlink2 = nlink3;
         size2 = size3;
         flag2 = flag3;
         midx2 = midx3;
         atype2 = atype3;

         mora3 = NULL;
         nlink3 = NULL;
         size3 = 0;
         flag3 = -1;
         midx3 = 0;
         atype3 = 0;
      }

      NJDNode_set_pron(node, buff);
   }
}